

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_table.c
# Opt level: O1

void auxsort(lua_State *L,int l,int u)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int local_38;
  
  do {
    if (u <= l) {
      return;
    }
    lua_rawgeti(L,1,l);
    lua_rawgeti(L,1,u);
    iVar2 = sort_comp(L,-1,-2);
    if (iVar2 == 0) {
      lua_settop(L,-3);
    }
    else {
      lua_rawseti(L,1,l);
      lua_rawseti(L,1,u);
    }
    if (u - l == 1) {
LAB_00158831:
      bVar1 = false;
    }
    else {
      local_38 = (u + l) / 2;
      lua_rawgeti(L,1,local_38);
      lua_rawgeti(L,1,l);
      iVar2 = sort_comp(L,-2,-1);
      if (iVar2 == 0) {
        lua_settop(L,-2);
        lua_rawgeti(L,1,u);
        iVar2 = sort_comp(L,-1,-2);
        if (iVar2 != 0) {
          lua_rawseti(L,1,local_38);
          iVar2 = u;
          goto LAB_00158827;
        }
        lua_settop(L,-3);
      }
      else {
        lua_rawseti(L,1,local_38);
        iVar2 = l;
LAB_00158827:
        lua_rawseti(L,1,iVar2);
      }
      if (u - l == 2) goto LAB_00158831;
      lua_rawgeti(L,1,local_38);
      lua_pushvalue(L,-1);
      iVar5 = u + -1;
      lua_rawgeti(L,1,iVar5);
      iVar2 = iVar5;
      iVar3 = l;
      do {
        iVar6 = iVar3;
        lua_rawseti(L,1,local_38);
        lua_rawseti(L,1,iVar2);
        local_38 = iVar6 + 1;
        lua_rawgeti(L,1,local_38);
        iVar3 = sort_comp(L,-1,-2);
        if (iVar3 != 0) {
          do {
            local_38 = iVar6;
            iVar6 = local_38 + 1;
            if (u <= iVar6) goto LAB_00158a63;
            lua_settop(L,-2);
            lua_rawgeti(L,1,local_38 + 2);
            iVar3 = sort_comp(L,-1,-2);
          } while (iVar3 != 0);
          local_38 = local_38 + 2;
        }
        lua_rawgeti(L,1,iVar2 + -1);
        iVar3 = sort_comp(L,-3,-1);
        iVar4 = iVar2;
        iVar2 = iVar2 + -1;
        if (iVar3 != 0) {
          do {
            iVar2 = iVar4;
            iVar4 = iVar2 + -1;
            if (iVar4 <= l) {
LAB_00158a63:
              lj_err_caller(L,LJ_ERR_TABSORT);
            }
            lua_settop(L,-2);
            lua_rawgeti(L,1,iVar2 + -2);
            iVar3 = sort_comp(L,-3,-1);
          } while (iVar3 != 0);
          iVar2 = iVar2 + -2;
        }
        iVar3 = local_38;
      } while (local_38 < iVar4);
      lua_settop(L,-4);
      lua_rawgeti(L,1,iVar5);
      lua_rawgeti(L,1,local_38);
      lua_rawseti(L,1,iVar5);
      lua_rawseti(L,1,local_38);
      iVar2 = iVar6 + 2;
      iVar5 = u;
      iVar3 = iVar6;
      if (local_38 - l < u - local_38) {
        iVar2 = l;
        iVar5 = iVar6;
        iVar3 = u;
        l = iVar6 + 2;
      }
      auxsort(L,iVar2,iVar5);
      bVar1 = true;
      u = iVar3;
    }
    if (!bVar1) {
      return;
    }
  } while( true );
}

Assistant:

static void auxsort(lua_State *L, int l, int u)
{
  while (l < u) {  /* for tail recursion */
    int i, j;
    /* sort elements a[l], a[(l+u)/2] and a[u] */
    lua_rawgeti(L, 1, l);
    lua_rawgeti(L, 1, u);
    if (sort_comp(L, -1, -2))  /* a[u] < a[l]? */
      set2(L, l, u);  /* swap a[l] - a[u] */
    else
      lua_pop(L, 2);
    if (u-l == 1) break;  /* only 2 elements */
    i = (l+u)/2;
    lua_rawgeti(L, 1, i);
    lua_rawgeti(L, 1, l);
    if (sort_comp(L, -2, -1)) {  /* a[i]<a[l]? */
      set2(L, i, l);
    } else {
      lua_pop(L, 1);  /* remove a[l] */
      lua_rawgeti(L, 1, u);
      if (sort_comp(L, -1, -2))  /* a[u]<a[i]? */
	set2(L, i, u);
      else
	lua_pop(L, 2);
    }
    if (u-l == 2) break;  /* only 3 elements */
    lua_rawgeti(L, 1, i);  /* Pivot */
    lua_pushvalue(L, -1);
    lua_rawgeti(L, 1, u-1);
    set2(L, i, u-1);
    /* a[l] <= P == a[u-1] <= a[u], only need to sort from l+1 to u-2 */
    i = l; j = u-1;
    for (;;) {  /* invariant: a[l..i] <= P <= a[j..u] */
      /* repeat ++i until a[i] >= P */
      while (lua_rawgeti(L, 1, ++i), sort_comp(L, -1, -2)) {
	if (i>=u) lj_err_caller(L, LJ_ERR_TABSORT);
	lua_pop(L, 1);  /* remove a[i] */
      }
      /* repeat --j until a[j] <= P */
      while (lua_rawgeti(L, 1, --j), sort_comp(L, -3, -1)) {
	if (j<=l) lj_err_caller(L, LJ_ERR_TABSORT);
	lua_pop(L, 1);  /* remove a[j] */
      }
      if (j<i) {
	lua_pop(L, 3);  /* pop pivot, a[i], a[j] */
	break;
      }
      set2(L, i, j);
    }
    lua_rawgeti(L, 1, u-1);
    lua_rawgeti(L, 1, i);
    set2(L, u-1, i);  /* swap pivot (a[u-1]) with a[i] */
    /* a[l..i-1] <= a[i] == P <= a[i+1..u] */
    /* adjust so that smaller half is in [j..i] and larger one in [l..u] */
    if (i-l < u-i) {
      j=l; i=i-1; l=i+2;
    } else {
      j=i+1; i=u; u=j-2;
    }
    auxsort(L, j, i);  /* call recursively the smaller one */
  }  /* repeat the routine for the larger one */
}